

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<long_double>_> *object)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  void *pvVar4;
  TPZEqnArray<std::complex<long_double>_> *pTVar5;
  TPZEqnArray<std::complex<long_double>_> *pTVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
    if (lVar7 != newsize) {
      lVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc;
      if (lVar9 < newsize) {
        if ((ulong)newsize < 0xb) {
          puVar1 = &this->field_0x20;
          lVar9 = 0;
          for (lVar11 = 0; lVar11 < lVar7; lVar11 = lVar11 + 1) {
            TPZEqnArray<std::complex<long_double>_>::operator=
                      ((TPZEqnArray<std::complex<long_double>_> *)(puVar1 + lVar9),
                       (TPZEqnArray<std::complex<long_double>_> *)
                       ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).
                               fStore)->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar9 + -0x28));
            lVar7 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
            lVar9 = lVar9 + 0x9060;
          }
          lVar7 = lVar11;
          if (lVar11 < newsize) {
            lVar7 = newsize;
          }
          pTVar5 = (TPZEqnArray<std::complex<long_double>_> *)(puVar1 + lVar9);
          for (; lVar11 != lVar7; lVar7 = lVar7 + -1) {
            TPZEqnArray<std::complex<long_double>_>::operator=(pTVar5,object);
            pTVar5 = pTVar5 + 1;
          }
          pTVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
          if (pTVar5 != (TPZEqnArray<std::complex<long_double>_> *)0x0 &&
              pTVar5 != (TPZEqnArray<std::complex<long_double>_> *)puVar1) {
            lVar7 = *(long *)&pTVar5[-1].field_0x9058;
            if (lVar7 != 0) {
              lVar9 = lVar7 * 0x9060;
              do {
                TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray
                          ((TPZEqnArray<std::complex<long_double>_> *)
                           ((long)pTVar5[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar9 + -0x28));
                lVar9 = lVar9 + -0x9060;
              } while (lVar9 != 0);
            }
            operator_delete__(&pTVar5[-1].fLastTerm,lVar7 * 0x9060 | 0x10);
          }
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore =
               (TPZEqnArray<std::complex<long_double>_> *)puVar1;
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = 10;
        }
        else {
          dVar12 = (double)lVar9 * 1.2;
          uVar10 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar10 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar10;
          uVar8 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x9060),8) == 0) {
            uVar8 = SUB168(auVar2 * ZEXT816(0x9060),0) | 0x10;
          }
          pvVar4 = operator_new__(uVar8);
          *(ulong *)((long)pvVar4 + 8) = uVar10;
          pTVar5 = (TPZEqnArray<std::complex<long_double>_> *)((long)pvVar4 + 0x10);
          if (uVar10 != 0) {
            lVar7 = 0;
            pTVar6 = pTVar5;
            do {
              TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(pTVar6);
              lVar7 = lVar7 + -0x9060;
              pTVar6 = pTVar6 + 1;
            } while (uVar10 * -0x9060 - lVar7 != 0);
          }
          lVar9 = 0;
          for (lVar7 = 0;
              lVar7 < (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
              lVar7 = lVar7 + 1) {
            TPZEqnArray<std::complex<long_double>_>::operator=
                      ((TPZEqnArray<std::complex<long_double>_> *)
                       ((long)(pTVar5->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar9 + -0x28),
                       (TPZEqnArray<std::complex<long_double>_> *)
                       ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).
                               fStore)->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar9 + -0x28));
            lVar9 = lVar9 + 0x9060;
          }
          lVar11 = lVar7;
          if (lVar7 < newsize) {
            lVar11 = newsize;
          }
          pTVar6 = (TPZEqnArray<std::complex<long_double>_> *)
                   ((long)(pTVar5->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar9 + -0x28)
          ;
          for (; lVar7 != lVar11; lVar11 = lVar11 + -1) {
            TPZEqnArray<std::complex<long_double>_>::operator=(pTVar6,object);
            pTVar6 = pTVar6 + 1;
          }
          pTVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
          if (pTVar6 != (TPZEqnArray<std::complex<long_double>_> *)0x0 &&
              pTVar6 != (TPZEqnArray<std::complex<long_double>_> *)&this->field_0x20) {
            lVar7 = *(long *)&pTVar6[-1].field_0x9058;
            if (lVar7 != 0) {
              lVar9 = lVar7 * 0x9060;
              do {
                TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray
                          ((TPZEqnArray<std::complex<long_double>_> *)
                           ((long)pTVar6[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar9 + -0x28));
                lVar9 = lVar9 + -0x9060;
              } while (lVar9 != 0);
            }
            operator_delete__(&pTVar6[-1].fLastTerm,lVar7 * 0x9060 | 0x10);
          }
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore = pTVar5;
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = uVar10;
        }
      }
      else {
        lVar9 = lVar7 * 0x9060;
        for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
          TPZEqnArray<std::complex<long_double>_>::operator=
                    ((TPZEqnArray<std::complex<long_double>_> *)
                     ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore)
                            ->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar9 + -0x28),
                     object);
          lVar9 = lVar9 + 0x9060;
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}